

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *this)

{
  VarBoundHandler<TestNLHandler2> *in_RDI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  reader;
  BinaryReader<mp::internal::IdentityConverter> bound_reader;
  VarBoundHandler<TestNLHandler2> bound_handler;
  TestNLHandler2 *in_stack_ffffffffffffff68;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  local_88;
  BinaryReader<mp::internal::IdentityConverter> local_58;
  VarBoundHandler<TestNLHandler2> local_18;
  
  if (((ulong)in_RDI[1].handler_ & 1) == 0) {
    Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)
         bound_handler.super_NullNLHandler<TestNLHandler2::TestExpr>.
         super_NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>.
         _vptr_NLHandler,
         (BinaryReader<mp::internal::IdentityConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._8_8_);
  }
  else {
    VarBoundHandler<TestNLHandler2>::VarBoundHandler(in_RDI,in_stack_ffffffffffffff68);
    BinaryReader<mp::internal::IdentityConverter>::BinaryReader
              ((BinaryReader<mp::internal::IdentityConverter> *)in_RDI,
               (BinaryReader<mp::internal::IdentityConverter> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
    ::NLReader(&local_88,&local_58,(NLHeader *)in_RDI->handler_,&local_18,
               *(int *)&in_RDI[1].handler_);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
    ::Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
            *)bound_handler.super_NullNLHandler<TestNLHandler2::TestExpr>.
              super_NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
              ._vptr_NLHandler,
           (BinaryReader<mp::internal::IdentityConverter> *)
           bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._8_8_);
    Read((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)
         bound_handler.super_NullNLHandler<TestNLHandler2::TestExpr>.
         super_NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>.
         _vptr_NLHandler,
         (BinaryReader<mp::internal::IdentityConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._8_8_);
    BinaryReader<mp::internal::IdentityConverter>::~BinaryReader
              ((BinaryReader<mp::internal::IdentityConverter> *)0x201f36);
    VarBoundHandler<TestNLHandler2>::~VarBoundHandler((VarBoundHandler<TestNLHandler2> *)0x201f43);
  }
  TestNLHandler2::EndInput
            ((TestNLHandler2 *)
             in_RDI[1].super_NullNLHandler<TestNLHandler2::TestExpr>.
             super_NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>.
             _vptr_NLHandler);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}